

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCRegisterInfo.cpp
# Opt level: O2

MCRegister __thiscall
llvm::MCRegisterInfo::getMatchingSuperReg
          (MCRegisterInfo *this,MCRegister Reg,uint SubIdx,MCRegisterClass *RC)

{
  bool bVar1;
  MCRegister MVar2;
  MCRegister Reg_00;
  undefined1 local_40 [8];
  MCSuperRegIterator Supers;
  
  MCSuperRegIterator::MCSuperRegIterator((MCSuperRegIterator *)local_40,Reg,this,false);
  while( true ) {
    if (Supers.super_DiffListIterator._0_8_ == 0) {
      return (MCRegister)0;
    }
    MVar2.Reg._2_2_ = 0;
    MVar2.Reg._0_2_ = local_40._0_2_;
    bVar1 = MCRegisterClass::contains(RC,MVar2);
    if ((bVar1) &&
       (Reg_00.Reg._2_2_ = 0, Reg_00.Reg._0_2_ = local_40._0_2_,
       MVar2 = getSubReg(this,Reg_00,SubIdx), MVar2.Reg == Reg.Reg)) break;
    DiffListIterator::operator++((DiffListIterator *)local_40);
  }
  return (MCRegister)(uint)(ushort)local_40._0_2_;
}

Assistant:

MCRegister
MCRegisterInfo::getMatchingSuperReg(MCRegister Reg, unsigned SubIdx,
                                    const MCRegisterClass *RC) const {
  for (MCSuperRegIterator Supers(Reg, this); Supers.isValid(); ++Supers)
    if (RC->contains(*Supers) && Reg == getSubReg(*Supers, SubIdx))
      return *Supers;
  return 0;
}